

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

void * flatcc_builder_append_vector(flatcc_builder_t *B,void *data,size_t count)

{
  uint uVar1;
  __flatcc_builder_frame_t *p_Var2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  uint8_t *__dest;
  uint uVar6;
  
  p_Var2 = B->frame;
  if (p_Var2->type != 4) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x3a8,
                  "void *flatcc_builder_append_vector(flatcc_builder_t *, const void *, size_t)");
  }
  uVar1 = (p_Var2->container).table.pl_end;
  uVar6 = (uint)count;
  uVar5 = uVar1 + uVar6;
  if ((CARRY4(uVar1,uVar6)) || ((p_Var2->container).table.vt_hash < uVar5)) {
    __assert_fail("n <= n1 && n1 <= max_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x391,
                  "int vector_count_add(flatcc_builder_t *, flatbuffers_uoffset_t, flatbuffers_uoffset_t)"
                 );
  }
  (p_Var2->container).table.pl_end = uVar5;
  uVar6 = uVar6 * (B->frame->container).table.vs_end;
  uVar1 = B->ds_offset;
  uVar5 = uVar1 + uVar6;
  B->ds_offset = uVar5;
  if (B->ds_limit <= uVar5) {
    iVar3 = reserve_ds(B,(ulong)(uVar5 + 1),0xfffffffc);
    if (iVar3 != 0) {
      __dest = (uint8_t *)0x0;
      goto LAB_00104a13;
    }
  }
  __dest = B->ds + uVar1;
LAB_00104a13:
  if (__dest != (uint8_t *)0x0) {
    pvVar4 = memcpy(__dest,data,(ulong)uVar6);
    return pvVar4;
  }
  return (void *)0x0;
}

Assistant:

void *flatcc_builder_append_vector(flatcc_builder_t *B, const void *data, size_t count)
{
    check(frame(type) == flatcc_builder_vector, "expected vector frame");
    if (vector_count_add(B, (uoffset_t)count, frame(container.vector.max_count))) {
        return 0;
    }
    return push_ds_copy(B, data, frame(container.vector.elem_size) * (uoffset_t)count);
}